

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O0

bool pd::prepareWord2vecInput
               (string *dir_name,string *out_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *dict)

{
  bool bVar1;
  byte bVar2;
  type this;
  string *psVar3;
  istream *piVar4;
  pointer pvVar5;
  reference pbVar6;
  ostream *poVar7;
  byte local_59a;
  byte local_54c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end9;
  const_iterator __begin9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range9;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
  local_518;
  const_iterator it_1;
  string line;
  long local_4e8;
  ifstream fi;
  path local_2e0;
  path *local_2c0;
  path *p;
  bool _foreach_continue259;
  auto_any_base *local_2a8;
  auto_any_t _foreach_end259;
  auto_any_base *local_298;
  auto_any_t _foreach_cur259;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_280;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *local_270;
  auto_any_t _foreach_col259;
  ofstream of;
  directory_iterator local_68;
  directory_iterator eod;
  directory_iterator local_50;
  directory_iterator it;
  path targetDir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *dict_local;
  string *out_filename_local;
  string *dir_name_local;
  
  boost::filesystem::path::path((path *)&it,dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_50,(path *)&it,none);
  boost::filesystem::directory_iterator::directory_iterator(&local_68);
  std::ofstream::ofstream(&_foreach_col259,(string *)out_filename,_S_out);
  std::make_pair<boost::filesystem::directory_iterator&,boost::filesystem::directory_iterator&>
            ((directory_iterator *)&_foreach_cur259,&local_50);
  boost::foreach_detail_::
  contain<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>>
            (&local_280,(true_ *)&_foreach_cur259);
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             &_foreach_cur259);
  local_270 = &local_280;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_270);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
              ((foreach_detail_ *)&_foreach_end259,(auto_any_t)local_270,
               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                *)0x0,(true_ *)0x0);
    local_298 = (auto_any_base *)&_foreach_end259;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_298);
    if (bVar1) {
LAB_00183c57:
      bVar1 = false;
    }
    else {
      boost::foreach_detail_::
      end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                ((foreach_detail_ *)&stack0xfffffffffffffd50,(auto_any_t)local_270,
                 (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                  *)0x0,(true_ *)0x0);
      local_2a8 = (auto_any_base *)&stack0xfffffffffffffd50;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2a8);
      if (!bVar1) {
        p._7_1_ = 1;
        while( true ) {
          local_54c = 0;
          if ((p._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                              (local_298,local_2a8,
                               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                *)0x0);
            local_54c = bVar1 ^ 0xff;
          }
          if ((local_54c & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&p + 7));
          if (!bVar1) {
            this = boost::foreach_detail_::
                   deref<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                             (local_298,
                              (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                               *)0x0);
            local_2c0 = boost::filesystem::directory_entry::operator_cast_to_path_(this);
            while (((p._7_1_ ^ 0xff) & 1) != 0) {
              bVar1 = boost::filesystem::is_regular_file(local_2c0);
              if (bVar1) {
                boost::filesystem::path::extension();
                bVar1 = boost::filesystem::operator==(&local_2e0,"swp");
                boost::filesystem::path::~path(&local_2e0);
                if (!bVar1) {
                  psVar3 = boost::filesystem::path::string_abi_cxx11_(local_2c0);
                  std::ifstream::ifstream(&local_4e8,(string *)psVar3,_S_in);
                  bVar2 = std::ios::operator!((ios *)((long)&local_4e8 +
                                                     *(long *)(local_4e8 + -0x18)));
                  if ((bVar2 & 1) == 0) {
                    std::__cxx11::string::string((string *)&it_1);
                    while( true ) {
                      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)&local_4e8,(string *)&it_1);
                      bVar1 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
                      local_59a = 0;
                      if (bVar1) {
                        local_59a = std::__cxx11::string::empty();
                        local_59a = local_59a ^ 0xff;
                      }
                      if ((local_59a & 1) == 0) break;
                      std::operator<<((ostream *)&_foreach_col259,(string *)&it_1);
                      local_518._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::find(dict,(key_type *)&it_1);
                      __range9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    ::end(dict);
                      bVar1 = std::__detail::operator==
                                        (&local_518,
                                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                                          *)&__range9);
                      if (!bVar1) {
                        pvVar5 = std::__detail::
                                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_true>
                                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_true>
                                               *)&local_518);
                        __end9 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin(&pvVar5->second);
                        s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end(&pvVar5->second);
                        while (bVar1 = __gnu_cxx::operator!=
                                                 (&__end9,(
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&s), bVar1) {
                          pbVar6 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&__end9);
                          poVar7 = std::operator<<((ostream *)&_foreach_col259," ");
                          std::operator<<(poVar7,(string *)pbVar6);
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++(&__end9);
                        }
                        std::operator<<((ostream *)&_foreach_col259," ");
                      }
                    }
                    std::__cxx11::string::~string((string *)&it_1);
                    bVar1 = false;
                  }
                  else {
                    poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
                    psVar3 = boost::filesystem::path::string_abi_cxx11_(local_2c0);
                    poVar7 = std::operator<<(poVar7,(string *)psVar3);
                    poVar7 = std::operator<<(poVar7,"doesn\'t exist");
                    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    dir_name_local._7_1_ = 0;
                    bVar1 = true;
                  }
                  std::ifstream::~ifstream(&local_4e8);
                  if (!bVar1) goto LAB_00183bd8;
                  goto LAB_00183c2f;
                }
              }
              else {
LAB_00183bd8:
                std::ostream::operator<<
                          ((ostream *)&_foreach_col259,std::endl<char,std::char_traits<char>>);
              }
              p._7_1_ = 1;
            }
          }
          if ((p._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                      (local_298,
                       (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                        *)0x0);
          }
        }
      }
      bVar1 = false;
LAB_00183c2f:
      boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
                ((auto_any<boost::filesystem::directory_iterator> *)&stack0xfffffffffffffd50);
      if (!bVar1) goto LAB_00183c57;
    }
    boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
              ((auto_any<boost::filesystem::directory_iterator> *)&_foreach_end259);
    if (bVar1) goto LAB_00183c93;
  }
  bVar1 = false;
LAB_00183c93:
  boost::foreach_detail_::
  auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
  ::~auto_any((auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
               *)&local_280);
  if (!bVar1) {
    dir_name_local._7_1_ = 1;
  }
  std::ofstream::~ofstream(&_foreach_col259);
  boost::filesystem::directory_iterator::~directory_iterator(&local_68);
  boost::filesystem::directory_iterator::~directory_iterator(&local_50);
  boost::filesystem::path::~path((path *)&it);
  return (bool)(dir_name_local._7_1_ & 1);
}

Assistant:

bool prepareWord2vecInput(const std::string& dir_name, const std::string& out_filename, const std::unordered_map<std::string, std::vector<std::string>>& dict)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(out_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                //std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                while (std::getline(fi, line) and !line.empty())
                {
                    of << line;
                    std::unordered_map<std::string, std::vector<std::string>>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    for (const auto& s: it->second)
                    {
                        of << " " << s;
                    }
                    of << " ";
                }                
            }
            of << std::endl; 
        }
        return true;
    }